

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool add_item_to_array(cJSON *array,cJSON *item)

{
  cJSON *pcVar1;
  cJSON *child;
  cJSON *item_local;
  cJSON *array_local;
  
  if (((item == (cJSON *)0x0) || (array == (cJSON *)0x0)) || (array == item)) {
    array_local._4_4_ = 0;
  }
  else {
    pcVar1 = array->child;
    if (pcVar1 == (cJSON *)0x0) {
      array->child = item;
      item->prev = item;
      item->next = (cJSON *)0x0;
    }
    else if (pcVar1->prev != (cJSON *)0x0) {
      suffix_object(pcVar1->prev,item);
      array->child->prev = item;
    }
    array_local._4_4_ = 1;
  }
  return array_local._4_4_;
}

Assistant:

static cJSON_bool add_item_to_array(cJSON *array, cJSON *item)
{
    cJSON *child = NULL;

    if ((item == NULL) || (array == NULL) || (array == item))
    {
        return false;
    }

    child = array->child;
    /*
     * To find the last item in array quickly, we use prev in array
     */
    if (child == NULL)
    {
        /* list is empty, start new one */
        array->child = item;
        item->prev = item;
        item->next = NULL;
    }
    else
    {
        /* append to the end */
        if (child->prev)
        {
            suffix_object(child->prev, item);
            array->child->prev = item;
        }
    }

    return true;
}